

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

Vec_Bit_t * Pla_ManPrimesTable(int nVars)

{
  Vec_Bit_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 1 << ((byte)nVars & 0x1f);
  uVar3 = 0x40;
  if (0x40 < (int)uVar4) {
    uVar3 = uVar4;
  }
  iVar2 = ((uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  iVar1 = iVar2 * 0x20;
  p = Vec_BitAlloc(iVar1);
  p->nSize = iVar1;
  memset(p->pArray,0xff,(ulong)(uint)(iVar2 * 4));
  for (uVar3 = uVar4; (int)uVar3 < 0x40; uVar3 = uVar3 + 1) {
    Vec_BitWriteEntry(p,uVar3,0);
  }
  if ((int)uVar4 <= iVar1) {
    p->nSize = uVar4;
    Vec_BitWriteEntry(p,0,0);
    Vec_BitWriteEntry(p,1,0);
    for (iVar1 = 2; iVar1 < (int)uVar4; iVar1 = iVar1 + 1) {
      iVar2 = Vec_BitEntry(p,iVar1);
      if (iVar2 != 0) {
        for (iVar2 = iVar1 * 2; iVar2 < (int)uVar4; iVar2 = iVar2 + iVar1) {
          Vec_BitWriteEntry(p,iVar2,0);
        }
      }
    }
    return p;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                ,0x1ec,"void Vec_BitShrink(Vec_Bit_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generates prime detector for the given bit-widths.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Bit_t * Pla_ManPrimesTable( int nVars )
{
    int i, n, nBits = 1 << nVars;
    Vec_Bit_t * vMap = Vec_BitStartFull( Abc_MaxInt(64, nBits) );
    for ( i = nBits; i < 64; i++ )
        Vec_BitWriteEntry( vMap, i, 0 );
    Vec_BitShrink( vMap, nBits );
    Vec_BitWriteEntry( vMap, 0, 0 );
    Vec_BitWriteEntry( vMap, 1, 0 );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            for ( i = 2*n; i < nBits; i += n )
                Vec_BitWriteEntry( vMap, i, 0 );
    return vMap;
}